

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<int,_63>::~TPZManVector(TPZManVector<int,_63> *this)

{
  TPZManVector<int,_63> *in_RDI;
  
  ~TPZManVector(in_RDI);
  operator_delete(in_RDI,0x120);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}